

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall QtPrivate::QColorWell::mousePressEvent(QColorWell *this,QMouseEvent *e)

{
  bool bVar1;
  int iVar2;
  QPoint QVar3;
  double dVar4;
  undefined1 auVar5 [16];
  
  iVar2 = (this->super_QWellArray).selCol;
  (this->oldCurrent).xp = (Representation)(this->super_QWellArray).selRow;
  (this->oldCurrent).yp = (Representation)iVar2;
  QWellArray::mousePressEvent(&this->super_QWellArray,e);
  this->mousePressed = true;
  auVar5 = QEventPoint::position();
  dVar4 = (double)((ulong)auVar5._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar5._0_8_;
  bVar1 = 2147483647.0 < dVar4;
  if (dVar4 <= -2147483648.0) {
    dVar4 = -2147483648.0;
  }
  QVar3.xp.m_i = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar4);
  dVar4 = (double)((ulong)auVar5._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar5._8_8_;
  bVar1 = 2147483647.0 < dVar4;
  if (dVar4 <= -2147483648.0) {
    dVar4 = -2147483648.0;
  }
  QVar3.yp.m_i = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar4);
  this->pressPos = QVar3;
  return;
}

Assistant:

void QColorWell::mousePressEvent(QMouseEvent *e)
{
    oldCurrent = QPoint(selectedRow(), selectedColumn());
    QWellArray::mousePressEvent(e);
    mousePressed = true;
    pressPos = e->position().toPoint();
}